

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O2

void ObsGetLegalMove(pyhanabi_observation_t *observation,int index,pyhanabi_move_t *move)

{
  void *pvVar1;
  value_type *pvVar2;
  const_reference pvVar3;
  
  if (observation == (pyhanabi_observation_t *)0x0) {
    __assert_fail("observation != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x324,"void ObsGetLegalMove(pyhanabi_observation_t *, int, pyhanabi_move_t *)");
  }
  pvVar1 = observation->observation;
  if (pvVar1 != (void *)0x0) {
    if (move != (pyhanabi_move_t *)0x0) {
      pvVar2 = (value_type *)operator_new(8);
      pvVar3 = std::
               vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
               ::at((vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                     *)((long)pvVar1 + 0x78),(long)index);
      *pvVar2 = *pvVar3;
      move->move = pvVar2;
      return;
    }
    __assert_fail("move != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x326,"void ObsGetLegalMove(pyhanabi_observation_t *, int, pyhanabi_move_t *)");
  }
  __assert_fail("observation->observation != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                ,0x325,"void ObsGetLegalMove(pyhanabi_observation_t *, int, pyhanabi_move_t *)");
}

Assistant:

void ObsGetLegalMove(pyhanabi_observation_t* observation, int index,
                     pyhanabi_move_t* move) {
  REQUIRE(observation != nullptr);
  REQUIRE(observation->observation != nullptr);
  REQUIRE(move != nullptr);
  move->move = new hanabi_learning_env::HanabiMove(
      (reinterpret_cast<hanabi_learning_env::HanabiObservation*>(
           observation->observation)
           ->LegalMoves()
           .at(index)));
}